

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> * __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::operator=
          (ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *this,
          ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *other)

{
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (ArrayPtr<const_capnp::word> *)0x0;
  other->pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
  other->endPtr = (ArrayPtr<const_capnp::word> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }